

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

int tclpkcs11_list_slots(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var1;
  uint uVar2;
  long lVar3;
  CK_RV errorCode;
  char *pcVar4;
  Tcl_Obj *pTVar5;
  Tcl_Obj *pTVar6;
  Tcl_Obj *pTVar7;
  Tcl_Obj *pTVar8;
  ulong uVar9;
  ProcErrorProc *pPVar10;
  CK_ULONG numSlots;
  CK_TOKEN_INFO tokenInfo;
  CK_SLOT_INFO slotInfo;
  Tcl_Obj *local_1b0;
  int local_1a8;
  undefined4 uStack_1a4;
  Tcl_Obj *local_1a0;
  Tcl_Obj *local_198;
  Tcl_Obj *local_190;
  long local_188;
  char *local_180;
  ulong local_178;
  char local_170 [32];
  char local_150 [32];
  char local_130 [16];
  char local_120 [16];
  ulong local_110;
  char local_a0 [96];
  byte local_40;
  
  if (cd == (ClientData)0x0) {
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid clientdata";
  }
  else if (objc == 2) {
    lVar3 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 0x18), lVar3 != 0)) {
      errorCode = (**(code **)(*(long *)(lVar3 + 8) + 0x28))(0,0,&local_1a8);
      if (errorCode == 0) {
        pcVar4 = (*tclStubsPtr->tcl_Alloc)(local_1a8 << 3);
        errorCode = (**(code **)(*(long *)(lVar3 + 8) + 0x28))(0,pcVar4,&local_1a8);
        if (errorCode == 0) {
          local_180 = pcVar4;
          local_190 = (*tclStubsPtr->tcl_NewObj)();
          if (CONCAT44(uStack_1a4,local_1a8) != 0) {
            uVar9 = 0;
            local_188 = lVar3;
            do {
              pcVar4 = local_180;
              lVar3 = (**(code **)(*(long *)(local_188 + 8) + 0x30))
                                (*(undefined8 *)(local_180 + uVar9 * 8),local_a0);
              pTVar6 = (*tclStubsPtr->tcl_NewObj)();
              p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
              local_178 = uVar9;
              pTVar5 = (*tclStubsPtr->tcl_NewLongObj)(*(long *)(pcVar4 + uVar9 * 8));
              (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar6,pTVar5);
              pTVar5 = (*tclStubsPtr->tcl_NewObj)();
              if (lVar3 == 0) {
                local_1b0 = (*tclStubsPtr->tcl_NewObj)();
                if ((local_40 & 1) == 0) {
                  pTVar7 = (Tcl_Obj *)0x0;
                }
                else {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_PRESENT",-1);
                  local_198 = pTVar5;
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                  lVar3 = (**(code **)(*(long *)(local_188 + 8) + 0x38))
                                    (*(undefined8 *)(local_180 + local_178 * 8),local_170);
                  if (lVar3 == 0) {
                    local_1a0 = (*tclStubsPtr->tcl_NewStringObj)(local_170,0x20);
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(local_170,0x20);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,local_1b0,pTVar5);
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(local_150,0x20);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,local_1b0,pTVar5);
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(local_130,0x10);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,local_1b0,pTVar5);
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(local_120,0x10);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,local_1b0,pTVar5);
                    pTVar5 = local_198;
                    if ((local_110 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("RNG",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                    }
                    if ((local_110 & 2) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("WRITE_PROTECTED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                    }
                    if ((local_110 & 4) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("LOGIN_REQUIRED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                    }
                    if ((local_110 & 8) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_INITIALIZED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                    }
                    if ((local_110 & 0x20) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("RESTORE_KEY_NOT_NEEDED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                    }
                    uVar2 = (uint)local_110;
                    if ((local_110 & 0x40) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("CLOCK_ON_TOKEN",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 8 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("PROTECTED_AUTHENTICATION_PATH",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 9 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("DUAL_CRYPTO_OPERATIONS",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 10 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_INITIALIZED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0xb & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("SECONDARY_AUTHENTICATION",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x10 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_COUNT_LOW",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x11 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_FINAL_TRY",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x12 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_LOCKED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x13 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_TO_BE_CHANGED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x14 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_COUNT_LOW",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x15 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_FINAL_TRY",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    if ((uVar2 >> 0x16 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_LOCKED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      uVar2 = (uint)local_110;
                    }
                    pTVar7 = local_1a0;
                    if ((uVar2 >> 0x17 & 1) != 0) {
                      p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                      pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_TO_BE_CHANGED",-1);
                      (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                      pTVar7 = local_1a0;
                    }
                  }
                  else {
                    pTVar7 = (Tcl_Obj *)0x0;
                    pTVar5 = local_198;
                  }
                }
                if ((local_40 & 2) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar8 = (*tclStubsPtr->tcl_NewStringObj)("REMOVABLE_DEVICE",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar8);
                }
                if ((local_40 & 4) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar8 = (*tclStubsPtr->tcl_NewStringObj)("HW_SLOT",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar8);
                }
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                if (pTVar7 == (Tcl_Obj *)0x0) {
                  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)(local_a0,0x20);
                }
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar6,pTVar7);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar6,pTVar5);
              }
              else {
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar7 = (*tclStubsPtr->tcl_NewStringObj)(anon_var_dwarf_1c02 + 10,0);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar6,pTVar7);
                local_1b0 = pTVar5;
              }
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,pTVar6,local_1b0);
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,local_190,pTVar6);
              uVar9 = local_178 + 1;
            } while (uVar9 < CONCAT44(uStack_1a4,local_1a8));
          }
          (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,local_190);
          return 0;
        }
      }
      pPVar10 = tclStubsPtr->tcl_SetObjResult;
      pTVar5 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_0010255d;
    }
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid handle";
  }
  else {
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "wrong # args: should be \"pki::pkcs11::listslots handle\"";
  }
  pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
LAB_0010255d:
  (*pPVar10)((Tcl_Interp_conflict *)interp,pTVar5);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_slots(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle;
  Tcl_Obj *ret_list, *curr_item_list, *flags_list, *slot_desc, *token_desc;

  CK_SLOT_ID_PTR slots;
  CK_SLOT_INFO slotInfo;
  CK_TOKEN_INFO tokenInfo;
  CK_ULONG numSlots, currSlot;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 2) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listslots handle\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, NULL, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  slots = (CK_SLOT_ID_PTR) ckalloc(sizeof(*slots) * numSlots);

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, slots, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();

  for (currSlot = 0; currSlot < numSlots; currSlot++) {
    chk_rv = handle->pkcs11->C_GetSlotInfo(slots[currSlot], &slotInfo);

    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewLongObj(slots[currSlot]));

    flags_list = Tcl_NewObj();

    if (chk_rv != CKR_OK) {
      /* Add an empty string as the token label */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("", 0));

      /* Add the list of existing flags (none) */
      Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

      /* Add this item to the list */
      Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);

      continue;
    }

    slot_desc = NULL;
    token_desc = Tcl_NewObj();

    if ((slotInfo.flags & CKF_TOKEN_PRESENT) == CKF_TOKEN_PRESENT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_PRESENT", -1));

      chk_rv = handle->pkcs11->C_GetTokenInfo(slots[currSlot], &tokenInfo);

      if (chk_rv == CKR_OK) {
        /* Add the token label as the slot label */
        if (!slot_desc) {
          slot_desc = Tcl_NewStringObj((const char *) tokenInfo.label, 32);
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.label, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.manufacturerID, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.model, 16));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.serialNumber, 16));
        }

        if ((tokenInfo.flags & CKF_RNG) == CKF_RNG) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RNG", -1));
        }
        if ((tokenInfo.flags & CKF_WRITE_PROTECTED) == CKF_WRITE_PROTECTED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("WRITE_PROTECTED", -1));
        }
        if ((tokenInfo.flags & CKF_LOGIN_REQUIRED) == CKF_LOGIN_REQUIRED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("LOGIN_REQUIRED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_INITIALIZED) == CKF_USER_PIN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_RESTORE_KEY_NOT_NEEDED) == CKF_RESTORE_KEY_NOT_NEEDED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RESTORE_KEY_NOT_NEEDED", -1));
        }
        if ((tokenInfo.flags & CKF_CLOCK_ON_TOKEN) == CKF_CLOCK_ON_TOKEN) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("CLOCK_ON_TOKEN", -1));
        }
        if ((tokenInfo.flags & CKF_PROTECTED_AUTHENTICATION_PATH) == CKF_PROTECTED_AUTHENTICATION_PATH) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("PROTECTED_AUTHENTICATION_PATH", -1));
        }
        if ((tokenInfo.flags & CKF_DUAL_CRYPTO_OPERATIONS) == CKF_DUAL_CRYPTO_OPERATIONS) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("DUAL_CRYPTO_OPERATIONS", -1));
        }
        if ((tokenInfo.flags & CKF_TOKEN_INITIALIZED) == CKF_TOKEN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_SECONDARY_AUTHENTICATION) == CKF_SECONDARY_AUTHENTICATION) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SECONDARY_AUTHENTICATION", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_COUNT_LOW) == CKF_USER_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_FINAL_TRY) == CKF_USER_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_LOCKED) == CKF_USER_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_TO_BE_CHANGED) == CKF_USER_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_TO_BE_CHANGED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_COUNT_LOW) == CKF_SO_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_FINAL_TRY) == CKF_SO_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_LOCKED) == CKF_SO_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_TO_BE_CHANGED) == CKF_SO_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_TO_BE_CHANGED", -1));
        }
      }
    }

    /* Add additional slot flags */
    if ((slotInfo.flags & CKF_REMOVABLE_DEVICE) == CKF_REMOVABLE_DEVICE) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("REMOVABLE_DEVICE", -1));
    }
    if ((slotInfo.flags & CKF_HW_SLOT) == CKF_HW_SLOT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("HW_SLOT", -1));
    }

    if (slot_desc) {
      /* If we found a more descriptive slot description, use it */
      Tcl_ListObjAppendElement(interp, curr_item_list, slot_desc);
    } else {
      /* Add the slot description as the label for tokens with nothing in them */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj((const char *) slotInfo.slotDescription, 32));
    }
    		
    Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

    /*Descryption token*/
    Tcl_ListObjAppendElement(interp, curr_item_list, token_desc);

    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  Tcl_SetObjResult(interp, ret_list);

  return(TCL_OK);
}